

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

xmlEnumerationPtr xmlCopyEnumeration(xmlEnumerationPtr cur)

{
  _xmlEnumeration *p_Var1;
  xmlEnumerationPtr pxVar2;
  xmlEnumerationPtr pxVar3;
  xmlEnumerationPtr pxVar4;
  xmlEnumerationPtr pxVar5;
  
  pxVar5 = (xmlEnumerationPtr)0x0;
  pxVar4 = (xmlEnumerationPtr)0x0;
  do {
    if (cur == (xmlEnumerationPtr)0x0) {
      return pxVar5;
    }
    pxVar2 = xmlCreateEnumeration(cur->name);
    pxVar3 = pxVar5;
    if (pxVar2 == (xmlEnumerationPtr)0x0) {
      while (pxVar3 != (xmlEnumerationPtr)0x0) {
        p_Var1 = pxVar3->next;
        (*xmlFree)(pxVar3->name);
        (*xmlFree)(pxVar3);
        pxVar3 = p_Var1;
      }
    }
    else {
      pxVar3 = pxVar2;
      if (pxVar5 != (xmlEnumerationPtr)0x0) {
        pxVar4->next = pxVar2;
        pxVar3 = pxVar5;
      }
      cur = cur->next;
      pxVar4 = pxVar2;
      pxVar5 = pxVar3;
    }
  } while (pxVar2 != (xmlEnumerationPtr)0x0);
  return (xmlEnumerationPtr)0x0;
}

Assistant:

xmlEnumerationPtr
xmlCopyEnumeration(xmlEnumerationPtr cur) {
    xmlEnumerationPtr ret = NULL;
    xmlEnumerationPtr last = NULL;

    while (cur != NULL) {
        xmlEnumerationPtr copy = xmlCreateEnumeration(cur->name);

        if (copy == NULL) {
            xmlFreeEnumeration(ret);
            return(NULL);
        }

        if (ret == NULL) {
            ret = last = copy;
        } else {
            last->next = copy;
            last = copy;
        }

        cur = cur->next;
    }

    return(ret);
}